

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O1

int save_cb(void *sysdata,void *userdata)

{
  prf_node_t *ppVar1;
  prf_nodeinfo_t *ppVar2;
  int iVar3;
  
  ppVar1 = *(prf_node_t **)((long)sysdata + 8);
  iVar3 = 2;
  if ((ppVar1->flags & 0x4001) == 0) {
    ppVar2 = prf_nodeinfo_get(ppVar1->opcode);
    if ((ppVar2 == (prf_nodeinfo_t *)0x0) ||
       (ppVar2->save_f == (_func_bool_t_prf_node_t_ptr_prf_state_t_ptr_bfile_t_ptr *)0x0)) {
      bf_put_uint16_be((bfile_t *)userdata,ppVar1->opcode);
      bf_put_uint16_be((bfile_t *)userdata,ppVar1->length);
      iVar3 = 1;
      if (4 < ppVar1->length) {
        bf_write((bfile_t *)userdata,ppVar1->data,ppVar1->length - 4);
      }
    }
    else {
      (*ppVar2->save_f)(ppVar1,(prf_state_t *)sysdata,(bfile_t *)userdata);
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

static
int
save_cb(
    void * sysdata,
    void * userdata )
{
    prf_state_t * state;
    bfile_t * bfile;
    prf_node_t * node;
    prf_nodeinfo_t * info;

    state = (prf_state_t *) sysdata;
    bfile = (bfile_t *) userdata;
    node = state->node;

    if ( (node->flags & PRF_NODE_DELETED) != 0 || /* deleted nodes */
         (node->flags & PRF_NODE_VIRTUAL) != 0 )  /* "fake" helper-nodes */
        return PRF_TRAV_SIBLING;

    info = prf_nodeinfo_get( node->opcode );
    if ( (info != NULL) && (info->save_f != NULL) ) {
        (*(info->save_f))( node, state, bfile );
    } else {
        bf_put_uint16_be( bfile, node->opcode );
        bf_put_uint16_be( bfile, node->length );
        if ( node->length > 4 )
            bf_write( bfile, node->data, node->length - 4 );
    }

    return PRF_TRAV_CONTINUE;
}